

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_ft_stroker.cpp
# Opt level: O0

SW_FT_Error SW_FT_Stroker_ParseOutline(SW_FT_Stroker stroker,SW_FT_Outline *outline)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  SW_FT_Error SVar5;
  long *plVar6;
  byte *pbVar7;
  short *in_RSI;
  SW_FT_Stroker in_RDI;
  SW_FT_Vector vec_2;
  SW_FT_Vector vec2;
  SW_FT_Vector vec1;
  SW_FT_Vector v_middle;
  SW_FT_Vector vec_1;
  SW_FT_Vector vec;
  SW_FT_UInt last;
  SW_FT_Int tag;
  SW_FT_UInt first;
  SW_FT_Int n;
  SW_FT_Error error;
  char *tags;
  SW_FT_Vector *limit;
  SW_FT_Vector *point;
  SW_FT_Vector v_start;
  SW_FT_Vector v_control;
  SW_FT_Vector v_last;
  SW_FT_Vector *in_stack_00000230;
  SW_FT_Vector *in_stack_00000238;
  SW_FT_Stroker in_stack_00000240;
  SW_FT_Vector *in_stack_00000298;
  SW_FT_Vector *in_stack_000002a0;
  SW_FT_Vector *in_stack_000002a8;
  SW_FT_Stroker in_stack_000002b0;
  SW_FT_Stroker in_stack_ffffffffffffff30;
  SW_FT_Vector *in_stack_ffffffffffffff58;
  SW_FT_Stroker in_stack_ffffffffffffff60;
  uint local_6c;
  int local_68;
  int local_64;
  byte *local_60;
  long *local_58;
  long *local_50;
  SW_FT_Vector local_48;
  long local_38;
  long local_30;
  long local_28;
  long local_20;
  short *local_18;
  SW_FT_Stroker local_10;
  SW_FT_Error local_4;
  
  if ((in_RSI == (short *)0x0) || (in_RDI == (SW_FT_Stroker)0x0)) {
    local_4 = -1;
  }
  else {
    local_18 = in_RSI;
    local_10 = in_RDI;
    SW_FT_Stroker_Rewind((SW_FT_Stroker)0x10fbda);
    local_6c = 0;
    for (local_68 = 0; local_68 < *local_18; local_68 = local_68 + 1) {
      uVar3 = (uint)*(short *)(*(long *)(local_18 + 0xc) + (long)local_68 * 2);
      local_58 = (long *)(*(long *)(local_18 + 4) + (ulong)uVar3 * 0x10);
      if (local_6c < uVar3) {
        plVar6 = (long *)(*(long *)(local_18 + 4) + (ulong)local_6c * 0x10);
        local_38 = *plVar6;
        local_30 = plVar6[1];
        plVar6 = (long *)(*(long *)(local_18 + 4) + (ulong)uVar3 * 0x10);
        local_28 = *plVar6;
        local_20 = plVar6[1];
        local_50 = (long *)(*(long *)(local_18 + 4) + (ulong)local_6c * 0x10);
        local_60 = (byte *)(*(long *)(local_18 + 8) + (ulong)local_6c);
        if ((*local_60 & 3) == 2) {
          return -2;
        }
        local_48.x = local_38;
        local_48.y = local_30;
        if ((*local_60 & 3) == 0) {
          if ((*(byte *)(*(long *)(local_18 + 8) + (ulong)uVar3) & 3) == 1) {
            local_58 = local_58 + -2;
            local_48.x = local_28;
            local_48.y = local_20;
          }
          else {
            local_48.x = (local_38 + local_28) / 2;
            local_48.y = (local_30 + local_20) / 2;
          }
          local_50 = local_50 + -2;
          local_60 = local_60 + -1;
        }
        iVar4 = SW_FT_Stroker_BeginSubPath
                          (local_10,&local_48,
                           *(SW_FT_Bool *)(*(long *)(local_18 + 0x10) + (long)local_68));
        pbVar7 = local_60;
        plVar6 = local_50;
        while( true ) {
          while( true ) {
            while( true ) {
              if (iVar4 != 0) {
                return iVar4;
              }
              local_64 = 0;
              if (local_58 <= plVar6) goto LAB_00110197;
              local_50 = plVar6 + 2;
              local_60 = pbVar7 + 1;
              if ((*local_60 & 3) != 0) break;
              local_38 = *local_50;
              local_30 = plVar6[3];
              while( true ) {
                if (local_58 <= local_50) {
                  local_64 = SW_FT_Stroker_ConicTo
                                       (in_stack_00000240,in_stack_00000238,in_stack_00000230);
                  goto LAB_00110197;
                }
                plVar6 = local_50 + 2;
                local_60 = local_60 + 1;
                lVar1 = *plVar6;
                lVar2 = local_50[3];
                if ((*local_60 & 3) == 1) break;
                if ((*local_60 & 3) != 0) {
                  return -2;
                }
                in_stack_ffffffffffffff58 = (SW_FT_Vector *)((local_38 + lVar1) / 2);
                in_stack_ffffffffffffff60 = (SW_FT_Stroker)((local_30 + lVar2) / 2);
                SVar5 = SW_FT_Stroker_ConicTo(in_stack_00000240,in_stack_00000238,in_stack_00000230)
                ;
                local_50 = plVar6;
                local_38 = lVar1;
                local_30 = lVar2;
                if (SVar5 != 0) {
                  return SVar5;
                }
              }
              iVar4 = SW_FT_Stroker_ConicTo(in_stack_00000240,in_stack_00000238,in_stack_00000230);
              pbVar7 = local_60;
            }
            if ((*local_60 & 3) != 1) break;
            iVar4 = SW_FT_Stroker_LineTo(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
            pbVar7 = local_60;
            plVar6 = local_50;
          }
          if (local_58 < plVar6 + 4) {
            return -2;
          }
          if ((pbVar7[2] & 3) != 2) {
            return -2;
          }
          pbVar7 = pbVar7 + 3;
          if (local_58 < plVar6 + 6) break;
          in_stack_ffffffffffffff30 = (SW_FT_Stroker)plVar6[7];
          iVar4 = SW_FT_Stroker_CubicTo
                            (in_stack_000002b0,in_stack_000002a8,in_stack_000002a0,in_stack_00000298
                            );
          plVar6 = plVar6 + 6;
        }
        local_64 = SW_FT_Stroker_CubicTo
                             (in_stack_000002b0,in_stack_000002a8,in_stack_000002a0,
                              in_stack_00000298);
LAB_00110197:
        if ((local_64 != 0) ||
           ((local_10->first_point == '\0' &&
            (local_64 = SW_FT_Stroker_EndSubPath(in_stack_ffffffffffffff30), local_64 != 0)))) {
          return local_64;
        }
      }
      local_6c = uVar3 + 1;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

SW_FT_Error SW_FT_Stroker_ParseOutline(SW_FT_Stroker        stroker,
                                       const SW_FT_Outline* outline)
{
    SW_FT_Vector v_last;
    SW_FT_Vector v_control;
    SW_FT_Vector v_start;

    SW_FT_Vector* point;
    SW_FT_Vector* limit;
    char*         tags;

    SW_FT_Error error;

    SW_FT_Int  n;     /* index of contour in outline     */
    SW_FT_UInt first; /* index of first point in contour */
    SW_FT_Int  tag;   /* current point's state           */

    if (!outline || !stroker) return -1;  // SW_FT_THROW( Invalid_Argument );

    SW_FT_Stroker_Rewind(stroker);

    first = 0;

    for (n = 0; n < outline->n_contours; n++) {
        SW_FT_UInt last; /* index of last point in contour */

        last = outline->contours[n];
        limit = outline->points + last;

        /* skip empty points; we don't stroke these */
        if (last <= first) {
            first = last + 1;
            continue;
        }

        v_start = outline->points[first];
        v_last = outline->points[last];

        v_control = v_start;

        point = outline->points + first;
        tags = outline->tags + first;
        tag = SW_FT_CURVE_TAG(tags[0]);

        /* A contour cannot start with a cubic control point! */
        if (tag == SW_FT_CURVE_TAG_CUBIC) goto Invalid_Outline;

        /* check first point to determine origin */
        if (tag == SW_FT_CURVE_TAG_CONIC) {
            /* First point is conic control.  Yes, this happens. */
            if (SW_FT_CURVE_TAG(outline->tags[last]) == SW_FT_CURVE_TAG_ON) {
                /* start at last point if it is on the curve */
                v_start = v_last;
                limit--;
            } else {
                /* if both first and last points are conic, */
                /* start at their middle                    */
                v_start.x = (v_start.x + v_last.x) / 2;
                v_start.y = (v_start.y + v_last.y) / 2;
            }
            point--;
            tags--;
        }

        error = SW_FT_Stroker_BeginSubPath(stroker, &v_start, outline->contours_flag[n]);
        if (error) goto Exit;

        while (point < limit) {
            point++;
            tags++;

            tag = SW_FT_CURVE_TAG(tags[0]);
            switch (tag) {
            case SW_FT_CURVE_TAG_ON: /* emit a single line_to */
            {
                SW_FT_Vector vec;

                vec.x = point->x;
                vec.y = point->y;

                error = SW_FT_Stroker_LineTo(stroker, &vec);
                if (error) goto Exit;
                continue;
            }

            case SW_FT_CURVE_TAG_CONIC: /* consume conic arcs */
                v_control.x = point->x;
                v_control.y = point->y;

            Do_Conic:
                if (point < limit) {
                    SW_FT_Vector vec;
                    SW_FT_Vector v_middle;

                    point++;
                    tags++;
                    tag = SW_FT_CURVE_TAG(tags[0]);

                    vec = point[0];

                    if (tag == SW_FT_CURVE_TAG_ON) {
                        error =
                            SW_FT_Stroker_ConicTo(stroker, &v_control, &vec);
                        if (error) goto Exit;
                        continue;
                    }

                    if (tag != SW_FT_CURVE_TAG_CONIC) goto Invalid_Outline;

                    v_middle.x = (v_control.x + vec.x) / 2;
                    v_middle.y = (v_control.y + vec.y) / 2;

                    error =
                        SW_FT_Stroker_ConicTo(stroker, &v_control, &v_middle);
                    if (error) goto Exit;

                    v_control = vec;
                    goto Do_Conic;
                }

                error = SW_FT_Stroker_ConicTo(stroker, &v_control, &v_start);
                goto Close;

            default: /* SW_FT_CURVE_TAG_CUBIC */
            {
                SW_FT_Vector vec1, vec2;

                if (point + 1 > limit ||
                    SW_FT_CURVE_TAG(tags[1]) != SW_FT_CURVE_TAG_CUBIC)
                    goto Invalid_Outline;

                point += 2;
                tags += 2;

                vec1 = point[-2];
                vec2 = point[-1];

                if (point <= limit) {
                    SW_FT_Vector vec;

                    vec = point[0];

                    error = SW_FT_Stroker_CubicTo(stroker, &vec1, &vec2, &vec);
                    if (error) goto Exit;
                    continue;
                }

                error = SW_FT_Stroker_CubicTo(stroker, &vec1, &vec2, &v_start);
                goto Close;
            }
            }
        }

    Close:
        if (error) goto Exit;

        /* don't try to end the path if no segments have been generated */
        if (!stroker->first_point) {
            error = SW_FT_Stroker_EndSubPath(stroker);
            if (error) goto Exit;
        }

        first = last + 1;
    }

    return 0;

Exit:
    return error;

Invalid_Outline:
    return -2;  // SW_FT_THROW( Invalid_Outline );
}